

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

uint __thiscall QHexView::calcAddressWidth(QHexView *this)

{
  quint64 qVar1;
  qint64 qVar2;
  ulong uVar3;
  uint uVar4;
  QArrayData *local_28 [2];
  uint local_18;
  
  if (this->m_hexdocument == (QHexDocument *)0x0) {
    uVar4 = 0;
  }
  else {
    qVar1 = (this->m_options).baseaddress;
    qVar2 = QHexDocument::length(this->m_hexdocument);
    uVar3 = qVar2 + qVar1;
    uVar4 = 8;
    if (uVar3 >> 0x20 != 0) {
      QString::number((ulonglong)local_28,(int)uVar3);
      uVar4 = local_18;
      if (local_28[0] != (QArrayData *)0x0) {
        LOCK();
        (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_28[0],2,8);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned int QHexView::calcAddressWidth() const {
    if(!m_hexdocument)
        return 0;

    auto maxaddr =
        static_cast<quint64>(m_options.baseaddress + m_hexdocument->length());
    if(maxaddr <= std::numeric_limits<quint32>::max())
        return 8;
    return QString::number(maxaddr, 16).size();
}